

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmNinjaNormalTargetGenerator::WriteDeviceLinkStatement(cmNinjaNormalTargetGenerator *this)

{
  cmOutputConverter *this_00;
  int iVar1;
  cmGeneratorTarget *this_01;
  pointer pbVar2;
  cmMakefile *pcVar3;
  pointer pcVar4;
  cmLocalNinjaGenerator *this_02;
  cmLocalNinjaGenerator *pcVar5;
  size_type sVar6;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *pvVar7;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last;
  bool bVar8;
  TargetType TVar9;
  string *psVar10;
  LinkClosure *pLVar11;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var12;
  char *pcVar13;
  long *plVar14;
  cmGlobalNinjaGenerator *pcVar15;
  cmGeneratedFileStream *pcVar16;
  size_t sVar17;
  ostream *poVar18;
  mapped_type *pmVar19;
  cmNinjaLinkLineDeviceComputer *this_03;
  mapped_type *flags;
  mapped_type *linkFlags;
  char *__s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar20;
  MapToNinjaPathImpl __unary_op;
  size_t sVar21;
  mapped_type *pmVar22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  size_type *psVar24;
  size_type sVar25;
  cmOutputConverter *outputConverter;
  long lVar26;
  cmNinjaNormalTargetGenerator *this_04;
  pointer cc;
  string objPath;
  bool usedResponseFile;
  key_type local_510;
  string rspfile;
  key_type local_460;
  cmNinjaNormalTargetGenerator *local_440;
  cmNinjaVars vars;
  string cfgName;
  string cudaLinkLanguage;
  string linkPath;
  string targetOutputReal;
  string frameworkPath;
  string cuda_lang;
  cmNinjaDeps byproducts;
  string createRule;
  string targetOutputImplib;
  string objExt;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  postBuildCmdLines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *cmdLineLists [3];
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *cmdLists [3];
  cmNinjaDeps outputs;
  cmNinjaDeps emptyDeps;
  cmNinjaDeps implicitDeps;
  cmNinjaDeps explicitDeps;
  ostringstream comment;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0 [6];
  ios_base local_190 [264];
  cmNinjaDeps local_88;
  cmNinjaDeps orderOnlyDeps;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  preLinkCmdLines;
  
  this_01 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  cuda_lang._M_dataplus._M_p = (pointer)&cuda_lang.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&cuda_lang,"CUDA","");
  psVar10 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
  pLVar11 = cmGeneratorTarget::GetLinkClosure(this_01,psVar10);
  local_440 = this;
  _Var12 = std::
           __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                     ((pLVar11->Languages).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (pLVar11->Languages).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,&cuda_lang);
  pbVar2 = (pLVar11->Languages).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  TVar9 = cmGeneratorTarget::GetType(this_01);
  if ((TVar9 - SHARED_LIBRARY < 2) || (TVar9 == EXECUTABLE)) {
    if (_Var12._M_current == pbVar2) goto LAB_0044174c;
  }
  else {
    if (TVar9 != STATIC_LIBRARY) goto LAB_0044174c;
    _comment = (pointer)local_1f0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&comment,"CUDA_RESOLVE_DEVICE_SYMBOLS","");
    bVar8 = cmGeneratorTarget::GetPropertyAsBool(this_01,(string *)&comment);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_comment != local_1f0) {
      operator_delete(_comment,local_1f0[0]._M_allocated_capacity + 1);
    }
    if (_Var12._M_current == pbVar2 || !bVar8) goto LAB_0044174c;
  }
  cudaLinkLanguage._M_dataplus._M_p = (pointer)&cudaLinkLanguage.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&cudaLinkLanguage,"CUDA","");
  this_04 = local_440;
  pcVar3 = (local_440->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
  _comment = (pointer)local_1f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&comment,"CMAKE_CUDA_OUTPUT_EXTENSION","");
  pcVar13 = cmMakefile::GetSafeDefinition(pcVar3,(string *)&comment);
  std::__cxx11::string::string((string *)&objExt,pcVar13,(allocator *)&rspfile);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_comment != local_1f0) {
    operator_delete(_comment,local_1f0[0]._M_allocated_capacity + 1);
  }
  psVar10 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this_04);
  cfgName._M_dataplus._M_p = (pointer)&cfgName.field_2;
  pcVar4 = (psVar10->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&cfgName,pcVar4,pcVar4 + psVar10->_M_string_length);
  rspfile._M_dataplus._M_p = (pointer)&rspfile.field_2;
  pcVar4 = (this_01->ObjectDirectory)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&rspfile,pcVar4,pcVar4 + (this_01->ObjectDirectory)._M_string_length);
  std::__cxx11::string::append((char *)&rspfile);
  plVar14 = (long *)std::__cxx11::string::_M_append((char *)&rspfile,(ulong)objExt._M_dataplus._M_p)
  ;
  paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar14 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar14 == paVar23) {
    local_1f0[0]._0_8_ = paVar23->_M_allocated_capacity;
    local_1f0[0]._8_8_ = plVar14[3];
    _comment = (pointer)local_1f0;
  }
  else {
    local_1f0[0]._0_8_ = paVar23->_M_allocated_capacity;
    _comment = (pointer)*plVar14;
  }
  lVar26 = plVar14[1];
  *plVar14 = (long)paVar23;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  pcVar15 = cmNinjaTargetGenerator::GetGlobalGenerator(&this_04->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::ConvertToNinjaPath(&targetOutputReal,pcVar15,(string *)&comment);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_comment != local_1f0) {
    operator_delete(_comment,local_1f0[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rspfile._M_dataplus._M_p != &rspfile.field_2) {
    operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
  }
  cmGeneratorTarget::GetFullPath((string *)&comment,this_01,&cfgName,ImportLibraryArtifact,false);
  pcVar15 = cmNinjaTargetGenerator::GetGlobalGenerator(&this_04->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::ConvertToNinjaPath(&targetOutputImplib,pcVar15,(string *)&comment);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_comment != local_1f0) {
    operator_delete(_comment,local_1f0[0]._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_assign((string *)&this_04->DeviceLinkObject);
  pcVar16 = cmNinjaTargetGenerator::GetBuildFileStream(&this_04->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::WriteDivider((ostream *)pcVar16);
  TVar9 = cmGeneratorTarget::GetType(this_01);
  pcVar16 = cmNinjaTargetGenerator::GetBuildFileStream(&this_04->super_cmNinjaTargetGenerator);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pcVar16,"# Device Link build statements for ",0x23);
  pcVar13 = cmState::GetTargetTypeName(TVar9);
  if (pcVar13 == (char *)0x0) {
    std::ios::clear((int)pcVar16 +
                    (int)(pcVar16->super_ofstream).
                         super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3])
    ;
  }
  else {
    sVar17 = strlen(pcVar13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar16,pcVar13,sVar17);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar16," target ",8);
  cmNinjaTargetGenerator::GetTargetName_abi_cxx11_
            ((string *)&comment,&this_04->super_cmNinjaTargetGenerator);
  poVar18 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar16,_comment,lVar26);
  std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\n\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_comment != local_1f0) {
    operator_delete(_comment,local_1f0[0]._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&comment);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&comment,"Link the ",9);
  pcVar13 = GetVisibleTypeName(this_04);
  if (pcVar13 == (char *)0x0) {
    std::ios::clear((int)&objPath + (int)*(undefined8 *)(_comment + -0x18) + 0x338);
  }
  else {
    sVar17 = strlen(pcVar13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&comment,pcVar13,sVar17);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&comment," ",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&comment,targetOutputReal._M_dataplus._M_p,targetOutputReal._M_string_length
            );
  emptyDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  emptyDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  emptyDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vars._M_t._M_impl.super__Rb_tree_header._M_header;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&outputs,&targetOutputReal);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&explicitDeps,&(this_04->super_cmNinjaTargetGenerator).Objects);
  cmNinjaTargetGenerator::ComputeLinkDeps_abi_cxx11_
            (&implicitDeps,&this_04->super_cmNinjaTargetGenerator);
  frameworkPath._M_dataplus._M_p = (pointer)&frameworkPath.field_2;
  frameworkPath._M_string_length = 0;
  frameworkPath.field_2._M_local_buf[0] = '\0';
  linkPath._M_dataplus._M_p = (pointer)&linkPath.field_2;
  linkPath._M_string_length = 0;
  linkPath.field_2._M_local_buf[0] = '\0';
  psVar10 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this_04);
  cmGeneratorTarget::GetCreateRuleVariable(&createRule,this_01,&this_04->TargetLinkLanguage,psVar10)
  ;
  pcVar3 = (this_04->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
  rspfile._M_dataplus._M_p = (pointer)&rspfile.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&rspfile,createRule._M_dataplus._M_p,
             createRule._M_dataplus._M_p + createRule._M_string_length);
  std::__cxx11::string::append((char *)&rspfile);
  bVar8 = cmMakefile::IsOn(pcVar3,&rspfile);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rspfile._M_dataplus._M_p != &rspfile.field_2) {
    operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
  }
  this_02 = (this_04->super_cmNinjaTargetGenerator).LocalGenerator;
  this_00 = &(this_02->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  cmOutputConverter::ConvertToOutputFormat(&rspfile,this_00,&targetOutputReal,SHELL);
  objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&objPath,"TARGET_FILE","");
  pmVar19 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&objPath);
  std::__cxx11::string::operator=((string *)pmVar19,(string *)&rspfile);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)objPath._M_dataplus._M_p != &objPath.field_2) {
    operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rspfile._M_dataplus._M_p != &rspfile.field_2) {
    operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
  }
  this_03 = (cmNinjaLinkLineDeviceComputer *)operator_new(0x48);
  pcVar5 = (this_04->super_cmNinjaTargetGenerator).LocalGenerator;
  outputConverter =
       &(pcVar5->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  if (pcVar5 == (cmLocalNinjaGenerator *)0x0) {
    outputConverter = (cmOutputConverter *)0x0;
  }
  cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&objPath,(cmLocalGenerator *)pcVar5);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&rspfile,(cmStateSnapshot *)&objPath);
  pcVar15 = cmNinjaTargetGenerator::GetGlobalGenerator(&this_04->super_cmNinjaTargetGenerator);
  cmNinjaLinkLineDeviceComputer::cmNinjaLinkLineDeviceComputer
            (this_03,outputConverter,(cmStateDirectory *)&rspfile,pcVar15);
  cmLinkLineComputer::SetUseWatcomQuote((cmLinkLineComputer *)this_03,bVar8);
  psVar10 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this_04);
  rspfile._M_dataplus._M_p = (pointer)&rspfile.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&rspfile,"LINK_LIBRARIES","");
  pmVar19 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&rspfile);
  objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&objPath,"FLAGS","");
  flags = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator[](&vars,&objPath);
  local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_510,"LINK_FLAGS","");
  linkFlags = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&local_510);
  cmLocalGenerator::GetTargetFlags
            ((cmLocalGenerator *)this_02,(cmLinkLineComputer *)this_03,psVar10,pmVar19,flags,
             linkFlags,&frameworkPath,&linkPath,this_01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510._M_dataplus._M_p != &local_510.field_2) {
    operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)objPath._M_dataplus._M_p != &objPath.field_2) {
    operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rspfile._M_dataplus._M_p != &rspfile.field_2) {
    operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
  }
  rspfile._M_dataplus._M_p = (pointer)&rspfile.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&rspfile,"JOB_POOL_LINK","");
  cmNinjaTargetGenerator::addPoolNinjaVariable
            (&this_04->super_cmNinjaTargetGenerator,&rspfile,this_01,&vars);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rspfile._M_dataplus._M_p != &rspfile.field_2) {
    operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
  }
  objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&objPath,"LINK_FLAGS","");
  pmVar19 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&objPath);
  cmGlobalNinjaGenerator::EncodeLiteral(&rspfile,pmVar19);
  local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_510,"LINK_FLAGS","");
  pmVar19 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&local_510);
  std::__cxx11::string::operator=((string *)pmVar19,(string *)&rspfile);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510._M_dataplus._M_p != &local_510.field_2) {
    operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rspfile._M_dataplus._M_p != &rspfile.field_2) {
    operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)objPath._M_dataplus._M_p != &objPath.field_2) {
    operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
  }
  cmCommonTargetGenerator::GetManifests_abi_cxx11_(&rspfile,(cmCommonTargetGenerator *)this_04);
  objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&objPath,"MANIFESTS","");
  pmVar19 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&objPath);
  std::__cxx11::string::operator=((string *)pmVar19,(string *)&rspfile);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)objPath._M_dataplus._M_p != &objPath.field_2) {
    operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rspfile._M_dataplus._M_p != &rspfile.field_2) {
    operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&rspfile,&frameworkPath,&linkPath);
  objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&objPath,"LINK_PATH","");
  pmVar19 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&objPath);
  std::__cxx11::string::operator=((string *)pmVar19,(string *)&rspfile);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)objPath._M_dataplus._M_p != &objPath.field_2) {
    operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rspfile._M_dataplus._M_p != &rspfile.field_2) {
    operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
  }
  objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
  if (TVar9 == EXECUTABLE) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&objPath,"FLAGS","");
    pmVar19 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&objPath);
    rspfile._M_dataplus._M_p = (pointer)&rspfile.field_2;
    pcVar4 = (pmVar19->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&rspfile,pcVar4,pcVar4 + pmVar19->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)objPath._M_dataplus._M_p != &objPath.field_2) {
      operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
    }
    cmLocalGenerator::AddArchitectureFlags
              ((cmLocalGenerator *)this_02,&rspfile,this_01,&cudaLinkLanguage,&cfgName);
    objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&objPath,"FLAGS","");
    pmVar19 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&objPath);
    std::__cxx11::string::_M_assign((string *)pmVar19);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&objPath,"ARCH_FLAGS","");
    pmVar19 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&objPath);
    rspfile._M_dataplus._M_p = (pointer)&rspfile.field_2;
    pcVar4 = (pmVar19->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&rspfile,pcVar4,pcVar4 + pmVar19->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)objPath._M_dataplus._M_p != &objPath.field_2) {
      operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
    }
    cmLocalGenerator::AddArchitectureFlags
              ((cmLocalGenerator *)this_02,&rspfile,this_01,&cudaLinkLanguage,&cfgName);
    objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&objPath,"ARCH_FLAGS","");
    pmVar19 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&objPath);
    std::__cxx11::string::_M_assign((string *)pmVar19);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)objPath._M_dataplus._M_p != &objPath.field_2) {
      operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_replace((ulong)&rspfile,0,(char *)rspfile._M_string_length,0x66eafa);
    cmLocalGenerator::AddLanguageFlagsForLinking
              ((cmLocalGenerator *)this_02,&rspfile,this_01,&cudaLinkLanguage,&cfgName);
    objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&objPath,"LANGUAGE_COMPILE_FLAGS","");
    pmVar19 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&objPath);
    std::__cxx11::string::_M_assign((string *)pmVar19);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)objPath._M_dataplus._M_p != &objPath.field_2) {
    operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rspfile._M_dataplus._M_p != &rspfile.field_2) {
    operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
  }
  bVar8 = cmGeneratorTarget::HasSOName
                    ((this_04->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                     GeneratorTarget,&cfgName);
  if (bVar8) {
    __s = cmMakefile::GetSONameFlag
                    ((this_04->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile,
                     &this_04->TargetLinkLanguage);
    rspfile._M_dataplus._M_p = (pointer)&rspfile.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&rspfile,"SONAME_FLAG","");
    pmVar19 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&rspfile);
    pcVar13 = (char *)pmVar19->_M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)pmVar19,0,pcVar13,(ulong)__s);
    this_04 = local_440;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rspfile._M_dataplus._M_p != &rspfile.field_2) {
      operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
    }
    rspfile._M_dataplus._M_p = (pointer)&rspfile.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&rspfile,"SONAME","");
    pmVar19 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&rspfile);
    std::__cxx11::string::_M_assign((string *)pmVar19);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rspfile._M_dataplus._M_p != &rspfile.field_2) {
      operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
    }
    if (TVar9 == SHARED_LIBRARY) {
      cmGeneratorTarget::GetInstallNameDirForBuildTree
                (&rspfile,(this_04->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                          GeneratorTarget,&cfgName);
      if (rspfile._M_string_length != 0) {
        cmOutputConverter::ConvertToOutputFormat(&objPath,this_00,&rspfile,SHELL);
        local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_510,"INSTALLNAME_DIR","");
        pmVar19 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&vars,&local_510);
        std::__cxx11::string::operator=((string *)pmVar19,(string *)&objPath);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_510._M_dataplus._M_p != &local_510.field_2) {
          operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)objPath._M_dataplus._M_p != &objPath.field_2) {
          operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)rspfile._M_dataplus._M_p != &rspfile.field_2) {
        operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
      }
    }
  }
  byproducts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  byproducts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  byproducts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((this_04->TargetNameImport)._M_string_length != 0) {
    cmOutputConverter::ConvertToOutputFormat(&rspfile,this_00,&targetOutputImplib,SHELL);
    objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&objPath,"TARGET_IMPLIB","");
    pmVar19 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&objPath);
    std::__cxx11::string::_M_assign((string *)pmVar19);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)objPath._M_dataplus._M_p != &objPath.field_2) {
      operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
    }
    cmNinjaTargetGenerator::EnsureParentDirectoryExists
              (&this_04->super_cmNinjaTargetGenerator,&rspfile);
    bVar8 = cmGeneratorTarget::HasImportLibrary(this_01);
    if (bVar8) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&byproducts,&targetOutputImplib);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rspfile._M_dataplus._M_p != &rspfile.field_2) {
      operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
    }
  }
  cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
            (&objPath,(this_04->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                      GeneratorTarget);
  pcVar5 = (this_04->super_cmNinjaTargetGenerator).LocalGenerator;
  pcVar15 = cmNinjaTargetGenerator::GetGlobalGenerator(&this_04->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::ConvertToNinjaPath(&local_510,pcVar15,&objPath);
  cmOutputConverter::ConvertToOutputFormat
            (&rspfile,&(pcVar5->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                       super_cmOutputConverter,&local_510,SHELL);
  local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"OBJECT_DIR","");
  pmVar19 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&local_460);
  std::__cxx11::string::operator=((string *)pmVar19,(string *)&rspfile);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p != &local_460.field_2) {
    operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rspfile._M_dataplus._M_p != &rspfile.field_2) {
    operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510._M_dataplus._M_p != &local_510.field_2) {
    operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
  }
  cmNinjaTargetGenerator::EnsureDirectoryExists(&this_04->super_cmNinjaTargetGenerator,&objPath);
  cmNinjaTargetGenerator::SetMsvcTargetPdbVariable(&this_04->super_cmNinjaTargetGenerator,&vars);
  pcVar15 = cmNinjaTargetGenerator::GetGlobalGenerator(&this_04->super_cmNinjaTargetGenerator);
  if (pcVar15->UsingGCCOnWindows == true) {
    rspfile._M_dataplus._M_p = (pointer)&rspfile.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&rspfile,"LINK_LIBRARIES","");
    pmVar19 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&rspfile);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rspfile._M_dataplus._M_p != &rspfile.field_2) {
      operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
    }
    sVar6 = pmVar19->_M_string_length;
    if (sVar6 != 0) {
      pcVar4 = (pmVar19->_M_dataplus)._M_p;
      sVar25 = 0;
      do {
        if (pcVar4[sVar25] == '\\') {
          pcVar4[sVar25] = '/';
        }
        sVar25 = sVar25 + 1;
      } while (sVar6 != sVar25);
    }
    rspfile._M_dataplus._M_p = (pointer)&rspfile.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&rspfile,"LINK_PATH","");
    pmVar19 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&rspfile);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rspfile._M_dataplus._M_p != &rspfile.field_2) {
      operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
    }
    sVar6 = pmVar19->_M_string_length;
    if (sVar6 != 0) {
      pcVar4 = (pmVar19->_M_dataplus)._M_p;
      sVar25 = 0;
      do {
        if (pcVar4[sVar25] == '\\') {
          pcVar4[sVar25] = '/';
        }
        sVar25 = sVar25 + 1;
      } while (sVar6 != sVar25);
    }
  }
  cmdLists[0] = cmGeneratorTarget::GetPreBuildCommands(this_01);
  cmdLists[1] = cmGeneratorTarget::GetPreLinkCommands(this_01);
  cmdLists[2] = cmGeneratorTarget::GetPostBuildCommands(this_01);
  preLinkCmdLines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  preLinkCmdLines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  preLinkCmdLines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  postBuildCmdLines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  postBuildCmdLines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  postBuildCmdLines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cmLocalNinjaGenerator::BuildCommandLine(&rspfile,this_02,&preLinkCmdLines);
  local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_510,"PRE_LINK","");
  pmVar19 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&local_510);
  std::__cxx11::string::operator=((string *)pmVar19,(string *)&rspfile);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510._M_dataplus._M_p != &local_510.field_2) {
    operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rspfile._M_dataplus._M_p != &rspfile.field_2) {
    operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
  }
  cmLocalNinjaGenerator::BuildCommandLine(&rspfile,this_02,&postBuildCmdLines);
  local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_510,"POST_BUILD","");
  pmVar19 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&local_510);
  std::__cxx11::string::operator=((string *)pmVar19,(string *)&rspfile);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510._M_dataplus._M_p != &local_510.field_2) {
    operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rspfile._M_dataplus._M_p != &rspfile.field_2) {
    operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
  }
  cmdLineLists[0] = &preLinkCmdLines;
  cmdLineLists[1] = &preLinkCmdLines;
  cmdLineLists[2] = &postBuildCmdLines;
  lVar26 = 0;
  do {
    pvVar7 = cmdLists[lVar26];
    cc = (pvVar7->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
         super__Vector_impl_data._M_start;
    if (cc != (pvVar7->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>).
              _M_impl.super__Vector_impl_data._M_finish) {
      do {
        cmCustomCommandGenerator::cmCustomCommandGenerator
                  ((cmCustomCommandGenerator *)&rspfile,cc,&cfgName,
                   (cmLocalGenerator *)(this_04->super_cmNinjaTargetGenerator).LocalGenerator);
        cmLocalNinjaGenerator::AppendCustomCommandLines
                  (this_02,(cmCustomCommandGenerator *)&rspfile,cmdLineLists[lVar26]);
        pvVar20 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_
                            ((cmCustomCommandGenerator *)&rspfile);
        _Var12._M_current =
             (pvVar20->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
        __last._M_current =
             (pvVar20->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        __unary_op.GG =
             cmNinjaTargetGenerator::GetGlobalGenerator(&local_440->super_cmNinjaTargetGenerator);
        std::
        transform<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
                  (_Var12,__last,&byproducts,__unary_op);
        cmCustomCommandGenerator::~cmCustomCommandGenerator((cmCustomCommandGenerator *)&rspfile);
        cc = cc + 1;
        this_04 = local_440;
      } while (cc != (pvVar7->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)
                     ._M_impl.super__Vector_impl_data._M_finish);
    }
    lVar26 = lVar26 + 1;
  } while (lVar26 != 3);
  pcVar15 = cmNinjaTargetGenerator::GetGlobalGenerator(&this_04->super_cmNinjaTargetGenerator);
  sVar21 = cmSystemTools::CalculateCommandLineLengthLimit();
  LanguageLinkerDeviceRule_abi_cxx11_(&rspfile,this_04);
  pmVar22 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::operator[](&pcVar15->RuleCmdLength,&rspfile);
  iVar1 = *pmVar22;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rspfile._M_dataplus._M_p != &rspfile.field_2) {
    operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
  }
  local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"CMakeFiles/","");
  psVar10 = cmGeneratorTarget::GetName_abi_cxx11_(this_01);
  plVar14 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_460,(ulong)(psVar10->_M_dataplus)._M_p);
  local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
  psVar24 = (size_type *)(plVar14 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar24) {
    local_510.field_2._M_allocated_capacity = *psVar24;
    local_510.field_2._8_8_ = plVar14[3];
  }
  else {
    local_510.field_2._M_allocated_capacity = *psVar24;
    local_510._M_dataplus._M_p = (pointer)*plVar14;
  }
  local_510._M_string_length = plVar14[1];
  *plVar14 = (long)psVar24;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_510);
  rspfile._M_dataplus._M_p = (pointer)&rspfile.field_2;
  psVar24 = (size_type *)(plVar14 + 2);
  if ((size_type *)*plVar14 == psVar24) {
    rspfile.field_2._M_allocated_capacity = *psVar24;
    rspfile.field_2._8_8_ = plVar14[3];
  }
  else {
    rspfile.field_2._M_allocated_capacity = *psVar24;
    rspfile._M_dataplus._M_p = (pointer)*plVar14;
  }
  rspfile._M_string_length = plVar14[1];
  *plVar14 = (long)psVar24;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510._M_dataplus._M_p != &local_510.field_2) {
    operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p != &local_460.field_2) {
    operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
  }
  orderOnlyDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  orderOnlyDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  orderOnlyDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmLocalNinjaGenerator::AppendTargetDepends
            ((this_04->super_cmNinjaTargetGenerator).LocalGenerator,
             (this_04->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             &orderOnlyDeps,DependOnTargetArtifact);
  usedResponseFile = false;
  pcVar16 = cmNinjaTargetGenerator::GetBuildFileStream(&this_04->super_cmNinjaTargetGenerator);
  std::__cxx11::stringbuf::str();
  LanguageLinkerDeviceRule_abi_cxx11_(&local_460,this_04);
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmGlobalNinjaGenerator::WriteBuild
            (pcVar15,(ostream *)pcVar16,&local_510,&local_460,&outputs,&local_88,&explicitDeps,
             &implicitDeps,&orderOnlyDeps,&vars,&rspfile,(int)sVar21 - iVar1,&usedResponseFile);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p != &local_460.field_2) {
    operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510._M_dataplus._M_p != &local_510.field_2) {
    operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
  }
  WriteDeviceLinkRule(this_04,usedResponseFile);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&orderOnlyDeps);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rspfile._M_dataplus._M_p != &rspfile.field_2) {
    operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&postBuildCmdLines);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&preLinkCmdLines);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)objPath._M_dataplus._M_p != &objPath.field_2) {
    operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&byproducts);
  (*(this_03->super_cmLinkLineDeviceComputer).super_cmLinkLineComputer._vptr_cmLinkLineComputer[1])
            ();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)createRule._M_dataplus._M_p != &createRule.field_2) {
    operator_delete(createRule._M_dataplus._M_p,createRule.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)linkPath._M_dataplus._M_p != &linkPath.field_2) {
    operator_delete(linkPath._M_dataplus._M_p,
                    CONCAT71(linkPath.field_2._M_allocated_capacity._1_7_,
                             linkPath.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)frameworkPath._M_dataplus._M_p != &frameworkPath.field_2) {
    operator_delete(frameworkPath._M_dataplus._M_p,
                    CONCAT71(frameworkPath.field_2._M_allocated_capacity._1_7_,
                             frameworkPath.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&implicitDeps);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&explicitDeps);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&outputs);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&vars._M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&emptyDeps);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&comment);
  std::ios_base::~ios_base(local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetOutputImplib._M_dataplus._M_p != &targetOutputImplib.field_2) {
    operator_delete(targetOutputImplib._M_dataplus._M_p,
                    targetOutputImplib.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetOutputReal._M_dataplus._M_p != &targetOutputReal.field_2) {
    operator_delete(targetOutputReal._M_dataplus._M_p,
                    targetOutputReal.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cfgName._M_dataplus._M_p != &cfgName.field_2) {
    operator_delete(cfgName._M_dataplus._M_p,cfgName.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)objExt._M_dataplus._M_p != &objExt.field_2) {
    operator_delete(objExt._M_dataplus._M_p,objExt.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cudaLinkLanguage._M_dataplus._M_p != &cudaLinkLanguage.field_2) {
    operator_delete(cudaLinkLanguage._M_dataplus._M_p,
                    cudaLinkLanguage.field_2._M_allocated_capacity + 1);
  }
LAB_0044174c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cuda_lang._M_dataplus._M_p != &cuda_lang.field_2) {
    operator_delete(cuda_lang._M_dataplus._M_p,cuda_lang.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteDeviceLinkStatement()
{
  cmGeneratorTarget& genTarget = *this->GetGeneratorTarget();

  // determine if we need to do any device linking for this target
  const std::string cuda_lang("CUDA");
  cmGeneratorTarget::LinkClosure const* closure =
    genTarget.GetLinkClosure(this->GetConfigName());

  const bool hasCUDA =
    (std::find(closure->Languages.begin(), closure->Languages.end(),
               cuda_lang) != closure->Languages.end());

  bool shouldHaveDeviceLinking = false;
  switch (genTarget.GetType()) {
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY:
    case cmStateEnums::EXECUTABLE:
      shouldHaveDeviceLinking = true;
      break;
    case cmStateEnums::STATIC_LIBRARY:
      shouldHaveDeviceLinking =
        genTarget.GetPropertyAsBool("CUDA_RESOLVE_DEVICE_SYMBOLS");
      break;
    default:
      break;
  }

  if (!(shouldHaveDeviceLinking && hasCUDA)) {
    return;
  }

  // Now we can do device linking

  // First and very important step is to make sure while inside this
  // step our link language is set to CUDA
  std::string cudaLinkLanguage = "CUDA";
  std::string const objExt =
    this->Makefile->GetSafeDefinition("CMAKE_CUDA_OUTPUT_EXTENSION");

  std::string const cfgName = this->GetConfigName();
  std::string const targetOutputReal = ConvertToNinjaPath(
    genTarget.ObjectDirectory + "cmake_device_link" + objExt);

  std::string const targetOutputImplib = ConvertToNinjaPath(
    genTarget.GetFullPath(cfgName, cmStateEnums::ImportLibraryArtifact));

  this->DeviceLinkObject = targetOutputReal;

  // Write comments.
  cmGlobalNinjaGenerator::WriteDivider(this->GetBuildFileStream());
  const cmStateEnums::TargetType targetType = genTarget.GetType();
  this->GetBuildFileStream() << "# Device Link build statements for "
                             << cmState::GetTargetTypeName(targetType)
                             << " target " << this->GetTargetName() << "\n\n";

  // Compute the comment.
  std::ostringstream comment;
  comment << "Link the " << this->GetVisibleTypeName() << " "
          << targetOutputReal;

  cmNinjaDeps emptyDeps;
  cmNinjaVars vars;

  // Compute outputs.
  cmNinjaDeps outputs;
  outputs.push_back(targetOutputReal);
  // Compute specific libraries to link with.
  cmNinjaDeps explicitDeps = this->GetObjects();
  cmNinjaDeps implicitDeps = this->ComputeLinkDeps();

  std::string frameworkPath;
  std::string linkPath;

  std::string createRule = genTarget.GetCreateRuleVariable(
    this->TargetLinkLanguage, this->GetConfigName());
  const bool useWatcomQuote =
    this->GetMakefile()->IsOn(createRule + "_USE_WATCOM_QUOTE");
  cmLocalNinjaGenerator& localGen = *this->GetLocalGenerator();

  vars["TARGET_FILE"] =
    localGen.ConvertToOutputFormat(targetOutputReal, cmOutputConverter::SHELL);

  CM_AUTO_PTR<cmLinkLineComputer> linkLineComputer(
    new cmNinjaLinkLineDeviceComputer(
      this->GetLocalGenerator(),
      this->GetLocalGenerator()->GetStateSnapshot().GetDirectory(),
      this->GetGlobalGenerator()));
  linkLineComputer->SetUseWatcomQuote(useWatcomQuote);

  localGen.GetTargetFlags(
    linkLineComputer.get(), this->GetConfigName(), vars["LINK_LIBRARIES"],
    vars["FLAGS"], vars["LINK_FLAGS"], frameworkPath, linkPath, &genTarget);

  this->addPoolNinjaVariable("JOB_POOL_LINK", &genTarget, vars);

  vars["LINK_FLAGS"] =
    cmGlobalNinjaGenerator::EncodeLiteral(vars["LINK_FLAGS"]);

  vars["MANIFESTS"] = this->GetManifests();

  vars["LINK_PATH"] = frameworkPath + linkPath;

  // Compute architecture specific link flags.  Yes, these go into a different
  // variable for executables, probably due to a mistake made when duplicating
  // code between the Makefile executable and library generators.
  if (targetType == cmStateEnums::EXECUTABLE) {
    std::string t = vars["FLAGS"];
    localGen.AddArchitectureFlags(t, &genTarget, cudaLinkLanguage, cfgName);
    vars["FLAGS"] = t;
  } else {
    std::string t = vars["ARCH_FLAGS"];
    localGen.AddArchitectureFlags(t, &genTarget, cudaLinkLanguage, cfgName);
    vars["ARCH_FLAGS"] = t;
    t = "";
    localGen.AddLanguageFlagsForLinking(t, &genTarget, cudaLinkLanguage,
                                        cfgName);
    vars["LANGUAGE_COMPILE_FLAGS"] = t;
  }
  if (this->GetGeneratorTarget()->HasSOName(cfgName)) {
    vars["SONAME_FLAG"] =
      this->GetMakefile()->GetSONameFlag(this->TargetLinkLanguage);
    vars["SONAME"] = this->TargetNameSO;
    if (targetType == cmStateEnums::SHARED_LIBRARY) {
      std::string install_dir =
        this->GetGeneratorTarget()->GetInstallNameDirForBuildTree(cfgName);
      if (!install_dir.empty()) {
        vars["INSTALLNAME_DIR"] = localGen.ConvertToOutputFormat(
          install_dir, cmOutputConverter::SHELL);
      }
    }
  }

  cmNinjaDeps byproducts;

  if (!this->TargetNameImport.empty()) {
    const std::string impLibPath = localGen.ConvertToOutputFormat(
      targetOutputImplib, cmOutputConverter::SHELL);
    vars["TARGET_IMPLIB"] = impLibPath;
    EnsureParentDirectoryExists(impLibPath);
    if (genTarget.HasImportLibrary()) {
      byproducts.push_back(targetOutputImplib);
    }
  }

  const std::string objPath = GetGeneratorTarget()->GetSupportDirectory();
  vars["OBJECT_DIR"] = this->GetLocalGenerator()->ConvertToOutputFormat(
    this->ConvertToNinjaPath(objPath), cmOutputConverter::SHELL);
  EnsureDirectoryExists(objPath);

  this->SetMsvcTargetPdbVariable(vars);

  if (this->GetGlobalGenerator()->IsGCCOnWindows()) {
    // ar.exe can't handle backslashes in rsp files (implicitly used by gcc)
    std::string& linkLibraries = vars["LINK_LIBRARIES"];
    std::replace(linkLibraries.begin(), linkLibraries.end(), '\\', '/');
    std::string& link_path = vars["LINK_PATH"];
    std::replace(link_path.begin(), link_path.end(), '\\', '/');
  }

  const std::vector<cmCustomCommand>* cmdLists[3] = {
    &genTarget.GetPreBuildCommands(), &genTarget.GetPreLinkCommands(),
    &genTarget.GetPostBuildCommands()
  };

  std::vector<std::string> preLinkCmdLines, postBuildCmdLines;
  vars["PRE_LINK"] = localGen.BuildCommandLine(preLinkCmdLines);
  vars["POST_BUILD"] = localGen.BuildCommandLine(postBuildCmdLines);

  std::vector<std::string>* cmdLineLists[3] = { &preLinkCmdLines,
                                                &preLinkCmdLines,
                                                &postBuildCmdLines };

  for (unsigned i = 0; i != 3; ++i) {
    for (std::vector<cmCustomCommand>::const_iterator ci =
           cmdLists[i]->begin();
         ci != cmdLists[i]->end(); ++ci) {
      cmCustomCommandGenerator ccg(*ci, cfgName, this->GetLocalGenerator());
      localGen.AppendCustomCommandLines(ccg, *cmdLineLists[i]);
      std::vector<std::string> const& ccByproducts = ccg.GetByproducts();
      std::transform(ccByproducts.begin(), ccByproducts.end(),
                     std::back_inserter(byproducts), MapToNinjaPath());
    }
  }

  cmGlobalNinjaGenerator& globalGen = *this->GetGlobalGenerator();

  // Device linking currently doesn't support response files so
  // do not check if the user has explicitly forced a response file.
  int const commandLineLengthLimit =
    static_cast<int>(cmSystemTools::CalculateCommandLineLengthLimit()) -
    globalGen.GetRuleCmdLength(this->LanguageLinkerDeviceRule());

  const std::string rspfile =
    std::string(cmake::GetCMakeFilesDirectoryPostSlash()) +
    genTarget.GetName() + ".rsp";

  // Gather order-only dependencies.
  cmNinjaDeps orderOnlyDeps;
  this->GetLocalGenerator()->AppendTargetDepends(this->GetGeneratorTarget(),
                                                 orderOnlyDeps);

  // Write the build statement for this target.
  bool usedResponseFile = false;
  globalGen.WriteBuild(this->GetBuildFileStream(), comment.str(),
                       this->LanguageLinkerDeviceRule(), outputs,
                       /*implicitOuts=*/cmNinjaDeps(), explicitDeps,
                       implicitDeps, orderOnlyDeps, vars, rspfile,
                       commandLineLengthLimit, &usedResponseFile);
  this->WriteDeviceLinkRule(usedResponseFile);
}